

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system_catalog.cpp
# Opt level: O1

iterator __thiscall SystemCatalog::getType(SystemCatalog *this,string *typeName)

{
  int iVar1;
  _Rb_tree_node_base *p_Var2;
  
  p_Var2 = (this->types)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  while (((_Rb_tree_header *)p_Var2 != &(this->types)._M_t._M_impl.super__Rb_tree_header &&
         (iVar1 = std::__cxx11::string::compare((string *)(p_Var2 + 1)), iVar1 != 0))) {
    p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2);
  }
  return (iterator)p_Var2;
}

Assistant:

set<type>::iterator SystemCatalog::getType(string &typeName) {
    set<type>::iterator i;

    for (i = types.begin(); i != types.end(); ++i) {
        if (i->typeName.compare(typeName) == 0) { break; }
    }

    return i;
}